

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_uses_proc_grid(Integer g_a)

{
  long lVar1;
  bool local_11;
  Integer ga_handle;
  Integer g_a_local;
  
  lVar1 = g_a + 1000;
  local_11 = true;
  if ((GA[lVar1].distr_type != 2) && (local_11 = true, GA[lVar1].distr_type != 3)) {
    local_11 = GA[lVar1].distr_type == 4;
  }
  return (long)(int)(uint)local_11;
}

Assistant:

logical pnga_uses_proc_grid(Integer g_a)
{
  Integer ga_handle = GA_OFFSET + g_a;
  return (logical)(GA[ga_handle].distr_type == SCALAPACK
      || GA[ga_handle].distr_type == TILED ||
      GA[ga_handle].distr_type == TILED_IRREG);
}